

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O0

void appendBasicRowsToBasis(HighsLp *lp,SimplexBasis *basis,HighsInt XnumNewRow)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  HighsInt iRow;
  HighsInt newNumTot;
  HighsInt newNumRow;
  int local_20;
  
  if (in_EDX != 0) {
    iVar1 = in_RDI[1];
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)unaff_retaddr,(size_type)in_RDI)
    ;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)unaff_retaddr,(size_type)in_RDI)
    ;
    std::vector<int,_std::allocator<int>_>::resize(unaff_retaddr,(size_type)in_RDI);
    for (local_20 = in_RDI[1]; local_20 < iVar1 + in_EDX; local_20 = local_20 + 1) {
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 1),
                          (long)(*in_RDI + local_20));
      *pvVar3 = '\0';
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 2),
                          (long)(*in_RDI + local_20));
      *pvVar3 = '\0';
      iVar2 = *in_RDI;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_20);
      *pvVar4 = iVar2 + local_20;
    }
  }
  return;
}

Assistant:

void appendBasicRowsToBasis(HighsLp& lp, SimplexBasis& basis,
                            HighsInt XnumNewRow) {
  // Add basic logicals
  if (XnumNewRow == 0) return;

  HighsInt newNumRow = lp.num_row_ + XnumNewRow;
  HighsInt newNumTot = lp.num_col_ + newNumRow;
  basis.nonbasicFlag_.resize(newNumTot);
  basis.nonbasicMove_.resize(newNumTot);
  basis.basicIndex_.resize(newNumRow);
  // Make the new rows basic
  for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++) {
    basis.nonbasicFlag_[lp.num_col_ + iRow] = kNonbasicFlagFalse;
    basis.nonbasicMove_[lp.num_col_ + iRow] = 0;
    basis.basicIndex_[iRow] = lp.num_col_ + iRow;
  }
}